

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 HashmapCmpCallback3(jx9_hashmap_node *pA,jx9_hashmap_node *pB,void *pCmpData)

{
  sxi32 sVar1;
  int in_ECX;
  jx9_value sB;
  jx9_value sA;
  jx9_value jStack_a8;
  jx9_value local_68;
  
  if (pCmpData == (void *)0x0) {
    sVar1 = HashmapNodeCmp(pA,pB,0);
  }
  else {
    jx9MemObjInit(pA->pMap->pVm,&local_68);
    jx9MemObjInit(pA->pMap->pVm,&jStack_a8);
    jx9HashmapExtractNodeValue(pA,&local_68,0);
    jx9HashmapExtractNodeValue(pB,&jStack_a8,0);
    if ((int)pCmpData == 5) {
      if (((byte)local_68.iFlags & 1) == 0) {
        jx9MemObjToString(&local_68);
      }
      if (((byte)jStack_a8.iFlags & 1) == 0) {
        jx9MemObjToString(&jStack_a8);
      }
    }
    else {
      jx9MemObjToNumeric(&local_68);
      jx9MemObjToNumeric(&jStack_a8);
    }
    sVar1 = jx9MemObjCmp(&local_68,&jStack_a8,0,in_ECX);
    jx9MemObjRelease(&local_68);
    jx9MemObjRelease(&jStack_a8);
  }
  return -sVar1;
}

Assistant:

static sxi32 HashmapCmpCallback3(jx9_hashmap_node *pA, jx9_hashmap_node *pB, void *pCmpData)
{
	jx9_value sA, sB;
	sxi32 iFlags;
	int rc;
	if( pCmpData == 0 ){
		/* Perform a standard comparison */
		rc = HashmapNodeCmp(pA, pB, FALSE);
		return -rc;
	}
	iFlags = SX_PTR_TO_INT(pCmpData);
	/* Duplicate node values */
	jx9MemObjInit(pA->pMap->pVm, &sA);
	jx9MemObjInit(pA->pMap->pVm, &sB);
	jx9HashmapExtractNodeValue(pA, &sA, FALSE);
	jx9HashmapExtractNodeValue(pB, &sB, FALSE);
	if( iFlags == 5 ){
		/* String cast */
		if( (sA.iFlags & MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(&sA);
		}
		if( (sB.iFlags & MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(&sB);
		}
	}else{
		/* Numeric cast */
		jx9MemObjToNumeric(&sA);
		jx9MemObjToNumeric(&sB);
	}
	/* Perform the comparison */
	rc = jx9MemObjCmp(&sA, &sB, FALSE, 0);
	jx9MemObjRelease(&sA);
	jx9MemObjRelease(&sB);
	return -rc;
}